

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall anon_unknown.dwarf_50a29::ChoiceExpr::parse_term(ChoiceExpr *this,Context *con)

{
  uint uVar1;
  int iVar2;
  element_type *peVar3;
  undefined1 local_40 [8];
  ParsingState st;
  Context *con_local;
  ChoiceExpr *this_local;
  
  st.matches = (size_t)con;
  ParsingState::ParsingState((ParsingState *)local_40,con);
  peVar3 = std::__shared_ptr_access<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&(this->super_BinaryExpr).left);
  uVar1 = (*peVar3->_vptr_Expr[3])(peVar3,st.matches);
  if ((uVar1 & 1) == 0) {
    pegmatite::Context::restore((Context *)st.matches,(ParsingState *)local_40);
    peVar3 = std::__shared_ptr_access<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_BinaryExpr).right);
    iVar2 = (*peVar3->_vptr_Expr[3])(peVar3,st.matches);
    this_local._7_1_ = (bool)((byte)iVar2 & 1);
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

virtual bool parse_term(Context &con) const
	{
		ParsingState st(con);
		if (left->parse_term(con)) return true;
		con.restore(st);
		return right->parse_term(con);
	}